

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall
HEkk::chooseSimplexStrategyThreads(HEkk *this,HighsOptions *options,HighsSimplexInfo *info)

{
  int iVar1;
  uint uVar2;
  __type _Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  iVar1 = (options->super_HighsOptionsStruct).simplex_strategy;
  info->simplex_strategy = iVar1;
  if (iVar1 == 0) {
    info->simplex_strategy = (uint)(info->num_primal_infeasibilities < 1) * 3 + 1;
  }
  uVar5 = 1;
  info->min_concurrency = 1;
  info->max_concurrency = 1;
  uVar6 = (options->super_HighsOptionsStruct).simplex_min_concurrency;
  uVar2 = (options->super_HighsOptionsStruct).simplex_max_concurrency;
  uVar4 = ::highs::parallel::num_threads();
  _Var3 = std::operator==(&(options->super_HighsOptionsStruct).parallel,&::kHighsOnString_abi_cxx11_
                         );
  iVar1 = info->simplex_strategy;
  if ((_Var3) && (0 < (int)uVar4 && iVar1 == 1)) {
    info->simplex_strategy = 3;
LAB_0032bc3a:
    bVar8 = SBORROW4(uVar6,2);
    iVar1 = -2;
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 != 3) {
        uVar5 = info->max_concurrency;
        goto LAB_0032bc6a;
      }
      goto LAB_0032bc3a;
    }
    bVar8 = SBORROW4(uVar6,4);
    iVar1 = -4;
    uVar5 = 3;
  }
  if (bVar8 == (int)(uVar6 + iVar1) < 0) {
    uVar5 = uVar6;
  }
  info->min_concurrency = uVar5;
  if ((int)uVar5 <= (int)uVar2) {
    uVar5 = uVar2;
  }
  info->max_concurrency = uVar5;
LAB_0032bc6a:
  uVar7 = (ulong)uVar5;
  info->num_concurrency = uVar5;
  if ((int)uVar5 < (int)uVar6) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                 "Using concurrency of %d for parallel strategy rather than minimum number (%d) specified in options\n"
                 ,uVar7,(ulong)uVar6);
    uVar7 = (ulong)(uint)info->num_concurrency;
  }
  uVar6 = (uint)uVar7;
  if ((int)uVar2 < (int)uVar6) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                 "Using concurrency of %d for parallel strategy rather than maximum number (%d) specified in options\n"
                 ,uVar7,(ulong)uVar2);
    uVar6 = info->num_concurrency;
  }
  if ((int)uVar4 < (int)uVar6) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                 "Number of threads available = %d < %d = Simplex concurrency to be used: Parallel performance may be less than anticipated\n"
                 ,(ulong)uVar4,(ulong)uVar6);
    return;
  }
  return;
}

Assistant:

void HEkk::chooseSimplexStrategyThreads(const HighsOptions& options,
                                        HighsSimplexInfo& info) {
  // Ensure that this is not called with an optimal basis
  assert(info.num_dual_infeasibilities > 0 ||
         info.num_primal_infeasibilities > 0);
  // Set the internal simplex strategy and number of threads for dual
  // simplex
  HighsInt& simplex_strategy = info.simplex_strategy;
  // By default, use the HighsOptions strategy. If this is
  // kSimplexStrategyChoose, then the strategy used will depend on
  // whether the current basis is primal feasible.
  simplex_strategy = options.simplex_strategy;
  if (simplex_strategy == kSimplexStrategyChoose) {
    // HiGHS is left to choose the simplex strategy
    if (info.num_primal_infeasibilities > 0) {
      // Not primal feasible, so use dual simplex
      simplex_strategy = kSimplexStrategyDual;
    } else {
      // Primal feasible. so use primal simplex
      simplex_strategy = kSimplexStrategyPrimal;
    }
  }
  // Set min/max_threads to correspond to serial code. They will be
  // set to other values if parallel options are used.
  info.min_concurrency = 1;
  info.max_concurrency = 1;
  // Record the min/max minimum concurrency in the options
  const HighsInt simplex_min_concurrency = options.simplex_min_concurrency;
  const HighsInt simplex_max_concurrency = options.simplex_max_concurrency;
  HighsInt max_threads = highs::parallel::num_threads();

  if (options.parallel == kHighsOnString &&
      simplex_strategy == kSimplexStrategyDual) {
    // The parallel strategy is on and the simplex strategy is dual so use
    // PAMI if there are enough threads
    if (max_threads >= kDualMultiMinConcurrency)
      simplex_strategy = kSimplexStrategyDualMulti;
  }
  //
  // If parallel strategies are used, the minimum concurrency will be
  // set to be at least the minimum required for the strategy
  //
  // All this is independent of the number of threads available, since
  // code with multiple concurrency can be run in serial.

  if (simplex_strategy == kSimplexStrategyDualTasks) {
    info.min_concurrency =
        max(kDualTasksMinConcurrency, simplex_min_concurrency);
    info.max_concurrency = max(info.min_concurrency, simplex_max_concurrency);
  } else if (simplex_strategy == kSimplexStrategyDualMulti) {
    info.min_concurrency =
        max(kDualMultiMinConcurrency, simplex_min_concurrency);
    info.max_concurrency = max(info.min_concurrency, simplex_max_concurrency);
  }

  // Set the concurrency to be used to be the maximum number
  info.num_concurrency = info.max_concurrency;
  // Give a warning if the concurrency to be used is less than the
  // minimum concurrency allowed
  if (info.num_concurrency < simplex_min_concurrency) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Using concurrency of %" HIGHSINT_FORMAT
                 " for parallel strategy rather than "
                 "minimum number (%" HIGHSINT_FORMAT ") specified in options\n",
                 info.num_concurrency, simplex_min_concurrency);
  }
  // Give a warning if the concurrency to be used is more than the
  // maximum concurrency allowed
  if (info.num_concurrency > simplex_max_concurrency) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Using concurrency of %" HIGHSINT_FORMAT
                 " for parallel strategy rather than "
                 "maximum number (%" HIGHSINT_FORMAT ") specified in options\n",
                 info.num_concurrency, simplex_max_concurrency);
  }
  // Give a warning if the concurrency to be used is less than the
  // number of threads available
  if (info.num_concurrency > max_threads) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Number of threads available = %" HIGHSINT_FORMAT
                 " < %" HIGHSINT_FORMAT
                 " = Simplex concurrency to be used: Parallel performance may "
                 "be less than anticipated\n",
                 max_threads, info.num_concurrency);
  }
}